

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O3

void anon_unknown.dwarf_1eb68::printLogs(void)

{
  int iVar1;
  string local_78;
  string local_58;
  ConsumeResult local_38;
  
  if ((anonymous_namespace)::printLogs()::textlog == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::printLogs()::textlog);
    if (iVar1 != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"%S [%d] %m\n","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"%Y-%m-%d %H:%M:%S.%N","")
      ;
      binlog::TextOutputStream::TextOutputStream
                (&printLogs::textlog,(ostream *)&std::cerr,&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(binlog::TextOutputStream::~TextOutputStream,&printLogs::textlog,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::printLogs()::textlog);
    }
  }
  binlog::consume<binlog::TextOutputStream>(&local_38,&printLogs::textlog);
  return;
}

Assistant:

void printLogs()
{
  static binlog::TextOutputStream textlog(std::cerr, "%S [%d] %m\n");
  binlog::consume(textlog);
}